

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkperfevents.cpp
# Opt level: O2

void __thiscall QBenchmarkPerfEventsMeasurer::start(QBenchmarkPerfEventsMeasurer *this)

{
  int *piVar1;
  parameter_type t;
  QArrayDataPointer<PerfEvent> *this_00;
  long lVar2;
  unsigned_long in_R8;
  PerfEvent *pPVar3;
  long lVar4;
  long in_FS_OFFSET;
  initializer_list<PerfEvent> args;
  QArrayDataPointer<PerfEvent> local_118;
  perf_event_attr local_100;
  PerfEvent local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_100,0,0x88);
  local_100.size = 0x88;
  local_100.read_format = 3;
  local_100._40_2_ = 0x2807;
  this_00 = &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_eventTypes>_>::
             instance()->d;
  if (this_00->size == 0) {
    local_48 = 0;
    uStack_40 = 4;
    local_58 = 0;
    uStack_50 = 1;
    local_68 = 0;
    uStack_60 = 0;
    local_78.type = 1;
    local_78._4_4_ = 0;
    local_78.config = 1;
    args._M_len = 4;
    args._M_array = &local_78;
    QList<PerfEvent>::QList((QList<PerfEvent> *)&local_118,args);
    QArrayDataPointer<PerfEvent>::operator=(this_00,&local_118);
    QArrayDataPointer<PerfEvent>::~QArrayDataPointer(&local_118);
  }
  lVar2 = (this->fds).d.size;
  if (lVar2 == 0) {
    QList<int>::reserve(&this->fds,this_00->size);
    pPVar3 = this_00->ptr;
    for (lVar2 = this_00->size << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
      local_100.type = pPVar3->type;
      local_100.config = pPVar3->config;
      t = perf_event_open(&local_100,-1,-1,8,in_R8);
      if (t == -1) {
        local_100._40_2_ = local_100._40_2_ | 0x60;
        t = perf_event_open(&local_100,-1,-1,8,in_R8);
        if (t == -1) {
          perror("QBenchmarkPerfEventsMeasurer::start: perf_event_open");
          exit(1);
        }
      }
      QList<int>::append(&this->fds,t);
      pPVar3 = pPVar3 + 1;
    }
    lVar2 = (this->fds).d.size;
  }
  piVar1 = (this->fds).d.ptr;
  for (lVar4 = 0; lVar2 * 4 != lVar4; lVar4 = lVar4 + 4) {
    ioctl(*(int *)((long)piVar1 + lVar4),0x2403);
  }
  prctl(0x20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBenchmarkPerfEventsMeasurer::start()
{
    QT_WARNING_DISABLE_GCC("-Wmissing-field-initializers")
    QT_WARNING_DISABLE_CLANG("-Wmissing-field-initializers")
    perf_event_attr attr = {
        .size = sizeof attr,
        .read_format = PERF_FORMAT_TOTAL_TIME_ENABLED | PERF_FORMAT_TOTAL_TIME_RUNNING,
        .disabled = true,       // we'll enable later
        .inherit = true,        // let children processes inherit the monitoring
        .pinned = true,         // keep it running in the hardware
        .inherit_stat = true,   // aggregate all the info from child processes
        .task = true,           // trace fork/exits
    };

    QList<PerfEvent> &counters = *eventTypes;
    if (counters.isEmpty())
        counters = defaultCounters();
    if (fds.isEmpty()) {
        pid_t pid = 0;      // attach to the current process only
        int cpu = -1;       // on any CPU
        int group_fd = -1;
        int flags = PERF_FLAG_FD_CLOEXEC;

        fds.reserve(counters.size());
        for (PerfEvent counter : std::as_const(counters)) {
            attr.type = counter.type;
            attr.config = counter.config;
            int fd = perf_event_open(&attr, pid, cpu, group_fd, flags);
            if (fd == -1) {
                // probably a paranoid kernel (/proc/sys/kernel/perf_event_paranoid)
                attr.exclude_kernel = true;
                attr.exclude_hv = true;
                fd = perf_event_open(&attr, pid, cpu, group_fd, flags);
            }
            if (fd == -1) {
                perror("QBenchmarkPerfEventsMeasurer::start: perf_event_open");
                exit(1);
            }

            fds.append(fd);
        }
    }

    // enable the counters
    for (int fd : std::as_const(fds))
        ::ioctl(fd, PERF_EVENT_IOC_RESET);
    prctl(PR_TASK_PERF_EVENTS_ENABLE);
}